

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_decay_deadline_init(arena_decay_t *decay)

{
  uint uVar1;
  ssize_t sVar2;
  uint64_t *puVar3;
  arena_decay_t *in_RDI;
  nstime_t jitter;
  uint lg_range;
  uint64_t ret;
  uint64_t state1;
  uint64_t ret_1;
  nstime_t local_58;
  arena_decay_t *local_50;
  int local_44;
  ulong local_40;
  uint64_t local_38;
  uint64_t *local_30;
  ulong local_28;
  ulong local_20;
  int local_14;
  uint64_t *local_10;
  ulong local_8;
  
  local_50 = in_RDI;
  nstime_copy(&in_RDI->deadline,&in_RDI->epoch);
  nstime_add(&local_50->deadline,&local_50->interval);
  sVar2 = arena_decay_ms_read(local_50);
  if (0 < sVar2) {
    puVar3 = &local_50->jitter_state;
    local_38 = nstime_ns(&local_50->interval);
    local_30 = puVar3;
    pow2_ceil_u64(local_38);
    uVar1 = ffs_u64(0x120399);
    local_44 = uVar1 - 1;
    do {
      local_10 = local_30;
      local_8 = *local_30;
      local_28 = local_8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
      *local_30 = local_28;
      local_40 = local_28 >> (0x40U - (char)local_44 & 0x3f);
    } while (local_38 <= local_40);
    local_20 = local_40;
    local_14 = local_44;
    nstime_init(&local_58,local_40);
    nstime_add(&local_50->deadline,&local_58);
  }
  return;
}

Assistant:

static void
arena_decay_deadline_init(arena_decay_t *decay) {
	/*
	 * Generate a new deadline that is uniformly random within the next
	 * epoch after the current one.
	 */
	nstime_copy(&decay->deadline, &decay->epoch);
	nstime_add(&decay->deadline, &decay->interval);
	if (arena_decay_ms_read(decay) > 0) {
		nstime_t jitter;

		nstime_init(&jitter, prng_range_u64(&decay->jitter_state,
		    nstime_ns(&decay->interval)));
		nstime_add(&decay->deadline, &jitter);
	}
}